

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void __thiscall ExampleAppConsole::ExecCommand(ExampleAppConsole *this,char *command_line)

{
  int iVar1;
  char **ppcVar2;
  undefined8 in_RSI;
  ExampleAppConsole *in_RDI;
  int i_2;
  int first;
  int i_1;
  int i;
  char **in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  uint uVar3;
  undefined4 in_stack_ffffffffffffffb4;
  char **in_stack_ffffffffffffffb8;
  ImVector<char_*> *s2;
  ImVector<char_*> *in_stack_ffffffffffffffc0;
  uint local_2c;
  int local_24;
  int local_14;
  
  AddLog(in_RDI,"# %s\n",in_RSI);
  in_RDI->HistoryPos = -1;
  local_14 = (in_RDI->History).Size;
  do {
    local_14 = local_14 + -1;
    if (local_14 < 0) goto LAB_00186bd2;
    ImVector<char_*>::operator[](&in_RDI->History,local_14);
    iVar1 = Stricmp((char *)in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8);
  } while (iVar1 != 0);
  ppcVar2 = ImVector<char_*>::operator[](&in_RDI->History,local_14);
  free(*ppcVar2);
  in_stack_ffffffffffffffc0 = &in_RDI->History;
  ImVector<char_*>::begin(&in_RDI->History);
  ImVector<char_*>::erase(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
LAB_00186bd2:
  s2 = &in_RDI->History;
  Strdup((char *)in_stack_ffffffffffffffc0);
  ImVector<char_*>::push_back
            ((ImVector<char_*> *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
             in_stack_ffffffffffffffa8);
  iVar1 = Stricmp((char *)in_stack_ffffffffffffffc0,(char *)s2);
  if (iVar1 == 0) {
    ClearLog((ExampleAppConsole *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  }
  else {
    iVar1 = Stricmp((char *)in_stack_ffffffffffffffc0,(char *)s2);
    if (iVar1 == 0) {
      AddLog(in_RDI,"Commands:");
      for (local_24 = 0; local_24 < (in_RDI->Commands).Size; local_24 = local_24 + 1) {
        ppcVar2 = ImVector<const_char_*>::operator[](&in_RDI->Commands,local_24);
        AddLog(in_RDI,"- %s",*ppcVar2);
      }
    }
    else {
      iVar1 = Stricmp((char *)in_stack_ffffffffffffffc0,(char *)s2);
      if (iVar1 == 0) {
        local_2c = (in_RDI->History).Size - 10;
        if ((int)local_2c < 1) {
          local_2c = 0;
        }
        for (; (int)local_2c < (in_RDI->History).Size; local_2c = local_2c + 1) {
          uVar3 = local_2c;
          ppcVar2 = ImVector<char_*>::operator[](&in_RDI->History,local_2c);
          AddLog(in_RDI,"%3d: %s\n",(ulong)uVar3,*ppcVar2);
        }
      }
      else {
        AddLog(in_RDI,"Unknown command: \'%s\'\n",in_RSI);
      }
    }
  }
  in_RDI->ScrollToBottom = true;
  return;
}

Assistant:

void    ExecCommand(const char* command_line)
    {
        AddLog("# %s\n", command_line);

        // Insert into history. First find match and delete it so it can be pushed to the back.
        // This isn't trying to be smart or optimal.
        HistoryPos = -1;
        for (int i = History.Size - 1; i >= 0; i--)
            if (Stricmp(History[i], command_line) == 0)
            {
                free(History[i]);
                History.erase(History.begin() + i);
                break;
            }
        History.push_back(Strdup(command_line));

        // Process command
        if (Stricmp(command_line, "CLEAR") == 0)
        {
            ClearLog();
        }
        else if (Stricmp(command_line, "HELP") == 0)
        {
            AddLog("Commands:");
            for (int i = 0; i < Commands.Size; i++)
                AddLog("- %s", Commands[i]);
        }
        else if (Stricmp(command_line, "HISTORY") == 0)
        {
            int first = History.Size - 10;
            for (int i = first > 0 ? first : 0; i < History.Size; i++)
                AddLog("%3d: %s\n", i, History[i]);
        }
        else
        {
            AddLog("Unknown command: '%s'\n", command_line);
        }

        // On command input, we scroll to bottom even if AutoScroll==false
        ScrollToBottom = true;
    }